

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *node;
  ExpressionStatementSyntax *pEVar1;
  Token TVar2;
  BumpAllocator *in_stack_00000068;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000070;
  BumpAllocator *in_stack_00000108;
  Token *in_stack_00000110;
  BumpAllocator *in_stack_ffffffffffffffb8;
  NamedLabelSyntax *in_stack_ffffffffffffffc0;
  NamedLabelSyntax *local_38;
  BumpAllocator *pBVar3;
  
  pBVar3 = (BumpAllocator *)__child_stack;
  if (*(long *)(__fn + 0x18) == 0) {
    local_38 = (NamedLabelSyntax *)0x0;
  }
  else {
    local_38 = deepClone<slang::syntax::NamedLabelSyntax>
                         (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  node = deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000070,in_stack_00000068);
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0xa33e07);
  deepClone<slang::syntax::ExpressionSyntax>((ExpressionSyntax *)node,in_stack_ffffffffffffffb8);
  TVar2 = parsing::Token::deepClone(in_stack_00000110,in_stack_00000108);
  pEVar1 = BumpAllocator::
           emplace<slang::syntax::ExpressionStatementSyntax,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::syntax::ExpressionSyntax&,slang::parsing::Token>
                     (pBVar3,(NamedLabelSyntax **)local_38,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)TVar2.info,TVar2._0_8_,
                      (Token *)__child_stack);
  return (int)pEVar1;
}

Assistant:

static SyntaxNode* clone(const ExpressionStatementSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ExpressionStatementSyntax>(
        node.label ? deepClone(*node.label, alloc) : nullptr,
        *deepClone(node.attributes, alloc),
        *deepClone<ExpressionSyntax>(*node.expr, alloc),
        node.semi.deepClone(alloc)
    );
}